

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffccls(fitsfile *infptr,fitsfile *outfptr,int incol,int outcol,int ncols,int create_col,
          int *status)

{
  int iVar1;
  int iStack_18d9c;
  int iStack_18d98;
  int iStack_18d94;
  int outcol1;
  int incol1;
  int icol;
  int ikey;
  char keyarr [1001] [81];
  char *tforms [1000];
  char *ttypes [1000];
  int typecodes [1000];
  float *fvalues;
  float fnull;
  double *dvalues;
  double dnull;
  char nulstr [2];
  char **strarray;
  char nullflag;
  char *lvalues;
  char tform_comm [73];
  char ttype_comm [73];
  char tform [71];
  char local_178 [8];
  char ttype [71];
  char local_128 [8];
  char keyname [75];
  long ii;
  long firstelem;
  long firstrow;
  long npixels;
  long ntodo;
  long ndone;
  long maxloop;
  long outloop;
  long inloop;
  long outrows;
  long nrows;
  long owidth;
  long width;
  long orepeat;
  long repeat;
  long tfields;
  int local_48;
  int outHduType;
  int inHduType;
  int anynull;
  int otypecode;
  int typecode;
  int colnum;
  int tstatus;
  int create_col_local;
  int ncols_local;
  int outcol_local;
  int incol_local;
  fitsfile *outfptr_local;
  fitsfile *infptr_local;
  
  incol1 = 0;
  if (*status < 1) {
    if (ncols < 0x3e9) {
      colnum = create_col;
      tstatus = ncols;
      create_col_local = outcol;
      ncols_local = incol;
      _outcol_local = outfptr;
      outfptr_local = infptr;
      if (infptr->HDUposition == infptr->Fptr->curhdu) {
        if (infptr->Fptr->datastart == -1) {
          ffrdef(infptr,status);
        }
      }
      else {
        ffmahd(infptr,infptr->HDUposition + 1,(int *)0x0,status);
      }
      local_48 = outfptr_local->Fptr->hdutype;
      if (_outcol_local->HDUposition == _outcol_local->Fptr->curhdu) {
        if (_outcol_local->Fptr->datastart == -1) {
          ffrdef(_outcol_local,status);
        }
      }
      else {
        ffmahd(_outcol_local,_outcol_local->HDUposition + 1,(int *)0x0,status);
      }
      tfields._4_4_ = _outcol_local->Fptr->hdutype;
      if (*status < 1) {
        if ((local_48 == 0) || (tfields._4_4_ == 0)) {
          ffpmsg("Can not copy columns to or from IMAGE HDUs (ffccls)");
          *status = 0xeb;
          infptr_local._4_4_ = 0xeb;
        }
        else if (((local_48 == 2) && (tfields._4_4_ == 1)) ||
                ((local_48 == 1 && (tfields._4_4_ == 2)))) {
          ffpmsg("Copying between Binary and ASCII tables is not supported (ffccls)");
          *status = 0xe3;
          infptr_local._4_4_ = 0xe3;
        }
        else if ((outfptr_local->Fptr == _outcol_local->Fptr) &&
                (outfptr_local->HDUposition == _outcol_local->HDUposition)) {
          ffpmsg("Copying multiple columns in same HDU is not supported (ffccls)");
          *status = 0xe3;
          infptr_local._4_4_ = 0xe3;
        }
        else {
          typecode = 0;
          iVar1 = ffgkyj(_outcol_local,"TFIELDS",&repeat,(char *)0x0,&typecode);
          if (iVar1 == 0) {
            if ((int)repeat + 1 < create_col_local) {
              iStack_18d9c = (int)repeat + 1;
            }
            else {
              iStack_18d9c = create_col_local;
            }
            otypecode = iStack_18d9c;
            iStack_18d94 = ncols_local;
            iStack_18d98 = iStack_18d9c;
            for (outcol1 = 0; outcol1 < tstatus; outcol1 = outcol1 + 1) {
              ffgtcl(outfptr_local,iStack_18d94,&anynull,&orepeat,&owidth,status);
              if (anynull < 0) {
                ffpmsg("Variable-length columns are not supported (ffccls)");
                *status = 0x105;
                return 0x105;
              }
              typecodes[(long)outcol1 + -2] = anynull;
              typecode = 0;
              ffkeyn("TTYPE",iStack_18d94,local_128,&typecode);
              ffgkys(outfptr_local,local_128,local_178,tform_comm + 0x48,&typecode);
              ffkeyn("TFORM",iStack_18d94,local_128,&typecode);
              iVar1 = ffgkys(outfptr_local,local_128,ttype_comm + 0x48,(char *)&lvalues,&typecode);
              if (iVar1 != 0) {
                ffpmsg("Could not find TTYPE and TFORM keywords in input table (ffccls)");
                *status = 0xe8;
                return 0xe8;
              }
              if (colnum == 0) {
                ffgtcl(_outcol_local,iStack_18d98,&inHduType,&width,&nrows,status);
                if (width != orepeat) {
                  ffpmsg("Input and output vector columns must have same length (ffccls)");
                  *status = 0x105;
                  return 0x105;
                }
              }
              else {
                iVar1 = incol1 + 1;
                *(long *)(keyarr[1000] + (long)outcol1 * 8 + 0x50) =
                     (long)&icol + (long)incol1 * 0x51;
                incol1 = incol1 + 2;
                tforms[(long)outcol1 + 999] = (char *)((long)&icol + (long)iVar1 * 0x51);
                strcpy(*(char **)(keyarr[1000] + (long)outcol1 * 8 + 0x50),ttype_comm + 0x48);
                strcpy(tforms[(long)outcol1 + 999],local_178);
              }
              iStack_18d94 = iStack_18d94 + 1;
              iStack_18d98 = iStack_18d98 + 1;
            }
            if (colnum != 0) {
              iVar1 = fficls(_outcol_local,otypecode,tstatus,tforms + 999,
                             (char **)(keyarr[1000] + 0x50),status);
              if (0 < iVar1) {
                ffpmsg("Could not append new columns to output file (ffccls)");
                return *status;
              }
              iStack_18d94 = ncols_local;
              iStack_18d98 = otypecode;
              for (outcol1 = 0; outcol1 < tstatus; outcol1 = outcol1 + 1) {
                ffkeyn("TTYPE",iStack_18d94,local_128,status);
                ffgkys(outfptr_local,local_128,local_178,tform_comm + 0x48,status);
                ffkeyn("TTYPE",iStack_18d98,local_128,status);
                ffmcom(_outcol_local,local_128,tform_comm + 0x48,status);
                ffkeyn("TFORM",iStack_18d94,local_128,status);
                ffgkys(outfptr_local,local_128,ttype_comm + 0x48,(char *)&lvalues,status);
                ffkeyn("TFORM",iStack_18d98,local_128,status);
                ffmcom(_outcol_local,local_128,(char *)&lvalues,status);
                ffcpky(outfptr_local,_outcol_local,iStack_18d94,iStack_18d98,"TUNIT",status);
                ffcpky(outfptr_local,_outcol_local,iStack_18d94,iStack_18d98,"TSCAL",status);
                ffcpky(outfptr_local,_outcol_local,iStack_18d94,iStack_18d98,"TZERO",status);
                ffcpky(outfptr_local,_outcol_local,iStack_18d94,iStack_18d98,"TDISP",status);
                ffcpky(outfptr_local,_outcol_local,iStack_18d94,iStack_18d98,"TLMIN",status);
                ffcpky(outfptr_local,_outcol_local,iStack_18d94,iStack_18d98,"TLMAX",status);
                ffcpky(outfptr_local,_outcol_local,iStack_18d94,iStack_18d98,"TDIM",status);
                ffcpky(outfptr_local,_outcol_local,iStack_18d94,iStack_18d98,"TCTYP",status);
                ffcpky(outfptr_local,_outcol_local,iStack_18d94,iStack_18d98,"TCUNI",status);
                ffcpky(outfptr_local,_outcol_local,iStack_18d94,iStack_18d98,"TCRVL",status);
                ffcpky(outfptr_local,_outcol_local,iStack_18d94,iStack_18d98,"TCRPX",status);
                ffcpky(outfptr_local,_outcol_local,iStack_18d94,iStack_18d98,"TCDLT",status);
                ffcpky(outfptr_local,_outcol_local,iStack_18d94,iStack_18d98,"TCROT",status);
                ffcpky(outfptr_local,_outcol_local,iStack_18d94,iStack_18d98,"TNULL",status);
                iStack_18d94 = iStack_18d94 + 1;
                iStack_18d98 = iStack_18d98 + 1;
              }
              iVar1 = ffrdef(_outcol_local,status);
              if (iVar1 != 0) {
                return *status;
              }
            }
            iStack_18d94 = ncols_local;
            iStack_18d98 = otypecode;
            for (outcol1 = 0; outcol1 < tstatus; outcol1 = outcol1 + 1) {
              ffcpcl(outfptr_local,_outcol_local,iStack_18d94,iStack_18d98,0,status);
              iStack_18d94 = iStack_18d94 + 1;
              iStack_18d98 = iStack_18d98 + 1;
            }
            infptr_local._4_4_ = *status;
          }
          else {
            ffpmsg("Could not read TFIELDS keyword in output table (ffccls)");
            *status = 0xe6;
            infptr_local._4_4_ = 0xe6;
          }
        }
      }
      else {
        infptr_local._4_4_ = *status;
      }
    }
    else {
      *status = 0x6f;
      infptr_local._4_4_ = 0x6f;
    }
  }
  else {
    infptr_local._4_4_ = *status;
  }
  return infptr_local._4_4_;
}

Assistant:

int ffccls(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           int incol,           /* I - number of first input column   */
           int outcol,          /* I - number for first output column  */
	   int ncols,           /* I - number of columns to copy from input to output */
           int create_col,      /* I - create new col if TRUE, else overwrite */
           int *status)         /* IO - error status     */
/*
  copy multiple columns from infptr and insert them in the outfptr
  table.  Optimized for multiple-column case since it only expands the
  output file once using fits_insert_cols() instead of calling
  fits_insert_col() multiple times.
*/
{
    int tstatus, colnum, typecode, otypecode, anynull;
    int inHduType, outHduType;
    long tfields, repeat, orepeat, width, owidth, nrows, outrows;
    long inloop, outloop, maxloop, ndone, ntodo, npixels;
    long firstrow, firstelem, ii;
    char keyname[FLEN_KEYWORD], ttype[FLEN_VALUE], tform[FLEN_VALUE];
    char ttype_comm[FLEN_COMMENT],tform_comm[FLEN_COMMENT];
    char *lvalues = 0, nullflag, **strarray = 0;
    char nulstr[] = {'\5', '\0'};  /* unique null string value */
    double dnull = 0.l, *dvalues = 0;
    float fnull = 0., *fvalues = 0;
    int typecodes[1000];
    char *ttypes[1000], *tforms[1000], keyarr[1001][FLEN_CARD];
    int ikey = 0;
    int icol, incol1, outcol1;

    if (*status > 0)
        return(*status);

    /* Do not allow more than internal array limit to be copied */
    if (ncols > 1000) return (*status = ARRAY_TOO_BIG);

    if (infptr->HDUposition != (infptr->Fptr)->curhdu)
    {
        ffmahd(infptr, (infptr->HDUposition) + 1, NULL, status);
    }
    else if ((infptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(infptr, status);                /* rescan header */
    inHduType = (infptr->Fptr)->hdutype;
    
    if (outfptr->HDUposition != (outfptr->Fptr)->curhdu)
    {
        ffmahd(outfptr, (outfptr->HDUposition) + 1, NULL, status);
    }
    else if ((outfptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(outfptr, status);               /* rescan header */
    outHduType = (outfptr->Fptr)->hdutype;
    
    if (*status > 0)
        return(*status);

    if (inHduType == IMAGE_HDU || outHduType == IMAGE_HDU)
    {
       ffpmsg
       ("Can not copy columns to or from IMAGE HDUs (ffccls)");
       return(*status = NOT_TABLE);
    }

    if ( (inHduType == BINARY_TBL &&  outHduType == ASCII_TBL) ||
	 (inHduType == ASCII_TBL  &&  outHduType == BINARY_TBL) )
    {
       ffpmsg
       ("Copying between Binary and ASCII tables is not supported (ffccls)");
       return(*status = NOT_BTABLE);
    }

    /* Do not allow copying multiple columns in the same HDU because the
       permutations of possible overlapping copies is mind-bending */
    if ((infptr->Fptr == outfptr->Fptr)
	&& (infptr->HDUposition == outfptr->HDUposition))
    {
       ffpmsg
       ("Copying multiple columns in same HDU is not supported (ffccls)");
       return(*status = NOT_BTABLE);
    }

    /* Retrieve the number of columns in output file */
    tstatus=0;
    if (ffgkyj(outfptr, "TFIELDS", &tfields, 0, &tstatus))
    {
      ffpmsg
	("Could not read TFIELDS keyword in output table (ffccls)");
      return(*status = NO_TFIELDS);
    }

    colnum = minvalue((int) tfields + 1, outcol); /* output col. number */

    /* Collect data about input column (type, repeat, etc) */
    for (incol1 = incol, outcol1 = colnum, icol = 0; 
	 icol < ncols; 
	 icol++, incol1++, outcol1++)
    {
      ffgtcl(infptr, incol1, &typecode, &repeat, &width, status);

      if (typecode < 0)
	{
	  ffpmsg("Variable-length columns are not supported (ffccls)");
	  return(*status = BAD_TFORM);
	}

      typecodes[icol] = typecode;

      tstatus = 0;
      ffkeyn("TTYPE", incol1, keyname, &tstatus);
      ffgkys(infptr, keyname, ttype, ttype_comm, &tstatus);

      ffkeyn("TFORM", incol1, keyname, &tstatus);
    
      if (ffgkys(infptr, keyname, tform, tform_comm, &tstatus) )
        {
          ffpmsg
	    ("Could not find TTYPE and TFORM keywords in input table (ffccls)");
          return(*status = NO_TFORM);
        }

      /* If creating columns, we need to save these values */
      if ( create_col ) {
	tforms[icol] = keyarr[ikey++];
	ttypes[icol] = keyarr[ikey++];

	strcpy(tforms[icol], tform);
	strcpy(ttypes[icol], ttype);
      } else {
	/* If not creating columns, then check the datatype and vector
	   repeat length of the output column */
        ffgtcl(outfptr, outcol1, &otypecode, &orepeat, &owidth, status);

        if (orepeat != repeat) {
            ffpmsg("Input and output vector columns must have same length (ffccls)");
            return(*status = BAD_TFORM);
        }
      }
    }

    /* Insert columns into output file and copy all meta-data
       keywords, if requested */
    if (create_col)
    {
        /* create the empty columns */
        if (fficls(outfptr, colnum, ncols, ttypes, tforms, status) > 0)
        {
           ffpmsg
           ("Could not append new columns to output file (ffccls)");
           return(*status);
        }

	/* Copy meta-data strings from input column to output */
	for (incol1 = incol, outcol1 = colnum, icol = 0; 
	     icol < ncols; 
	     icol++, incol1++, outcol1++)
	{
	  /* copy the comment strings from the input file for TTYPE and TFORM */
	  ffkeyn("TTYPE", incol1, keyname, status);
	  ffgkys(infptr, keyname, ttype, ttype_comm, status);
	  ffkeyn("TTYPE", outcol1, keyname, status);
	  ffmcom(outfptr, keyname, ttype_comm, status);
	  
	  ffkeyn("TFORM", incol1, keyname, status);
	  ffgkys(infptr, keyname, tform, tform_comm, status);
	  ffkeyn("TFORM", outcol1, keyname, status);
	  ffmcom(outfptr, keyname, tform_comm, status);
	  
	  /* copy other column-related keywords if they exist */
	  
	  ffcpky(infptr, outfptr, incol1, outcol1, "TUNIT", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TSCAL", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TZERO", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TDISP", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TLMIN", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TLMAX", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TDIM", status);

	  /*  WCS keywords */
	  ffcpky(infptr, outfptr, incol1, outcol1, "TCTYP", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TCUNI", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TCRVL", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TCRPX", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TCDLT", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TCROT", status);
	  
	  ffcpky(infptr, outfptr, incol1, outcol1, "TNULL", status);

	}

	/* rescan header to recognize the new keywords */
	if (ffrdef(outfptr, status) )
	  return(*status);
    }
	
    /* Copy columns using standard ffcpcl(); do this in a loop because
       the I/O-intensive column expanding is done */
    for (incol1 = incol, outcol1 = colnum, icol = 0; 
	 icol < ncols; 
	 icol++, incol1++, outcol1++)
    {
      ffcpcl(infptr, outfptr, incol1, outcol1, 0, status);
    }

    return(*status);
}